

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationX<std::complex<float>_>::matrix(RotationX<std::complex<float>_> *this)

{
  undefined4 uVar1;
  undefined1 (*pauVar2) [16];
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar3;
  uint local_28;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x10);
  local_28 = *(uint *)(in_RSI + 0x14) ^ (uint)DAT_00128060;
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x2;
  pauVar2 = (undefined1 (*) [16])operator_new__(0x20);
  *pauVar2 = (undefined1  [16])0x0;
  pauVar2[1] = (undefined1  [16])0x0;
  *(undefined1 (**) [16])
   &(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_ =
       pauVar2;
  *(undefined4 *)*pauVar2 = uVar1;
  *(undefined4 *)(*pauVar2 + 4) = 0;
  *(undefined4 *)(*pauVar2 + 8) = 0;
  *(uint *)(*pauVar2 + 0xc) = local_28;
  *(undefined4 *)pauVar2[1] = 0;
  *(uint *)(pauVar2[1] + 4) = local_28;
  *(undefined4 *)(pauVar2[1] + 8) = uVar1;
  *(undefined4 *)(pauVar2[1] + 0xc) = 0;
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using SqMat = qclab::dense::SquareMatrix< T > ;
          return SqMat(      this->cos()  , T(0,-this->sin()) ,
                        T(0,-this->sin()) ,      this->cos()  ) ;
        }